

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ident_v3.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  difference_type dVar4;
  reference pcVar5;
  difference_type distance;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_60;
  bool r;
  const_iterator end_iter;
  const_iterator iter;
  allocator<char> local_39;
  string local_38 [8];
  string input;
  char **argv_local;
  int argc_local;
  
  input.field_2._8_8_ = argv;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Need something to parse\n");
    exit(1);
  }
  __s = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  end_iter._M_current = (char *)std::__cxx11::string::cbegin();
  _Stack_60._M_current = (char *)std::__cxx11::string::cend();
  poVar3 = std::operator<<((ostream *)&std::cout,"parsing : ");
  poVar3 = std::operator<<(poVar3,local_38);
  std::operator<<(poVar3,"\n");
  bVar1 = boost::spirit::x3::
          phrase_parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::x3::plus<boost::spirit::x3::sequence<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::difference<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alpha_tag>,boost::spirit::x3::kleene<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::alternative<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>>>>>,boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,boost::spirit::x3::space_tag>>
                    (&end_iter,_Stack_60,&program_abi_cxx11_,
                     (char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>
                      *)&boost::spirit::x3::ascii::space,post_skip);
  bVar2 = __gnu_cxx::operator!=(&end_iter,&stack0xffffffffffffffa0);
  if (bVar2) {
    dVar4 = __gnu_cxx::operator-(&stack0xffffffffffffffa0,&end_iter);
    std::operator<<((ostream *)&std::cout,"Failed: didn\'t parse everything\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"stopped ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
    poVar3 = std::operator<<(poVar3," characters from the end ");
    poVar3 = std::operator<<(poVar3,"( \'");
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end_iter);
    poVar3 = std::operator<<(poVar3,*pcVar5);
    std::operator<<(poVar3,"\' )\n");
    argv_local._4_4_ = 1;
  }
  else if (bVar1) {
    std::operator<<((ostream *)&std::cout,"Good input\n");
    argv_local._4_4_ = 0;
  }
  else {
    std::operator<<((ostream *)&std::cout,"Parse failed\n");
    argv_local._4_4_ = 1;
  }
  std::__cxx11::string::~string(local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char**argv)
{
    if (argc < 2) {
        std::cout << "Need something to parse\n";
        exit(1);
    }

    std::string input(argv[1]);

    auto iter     = input.cbegin();
    auto end_iter = input.cend();

    std::cout << "parsing : " << input << "\n";
    bool r = x3::phrase_parse(iter, end_iter, program, x3::ascii::space);

    if (iter != end_iter) {
        auto distance = end_iter - iter;
        std::cout << "Failed: didn't parse everything\n";
        std::cout << "stopped " << distance << " characters from the end "
                  << "( '" << *iter << "' )\n";
        return 1;
    } else if (r) {
        std::cout << "Good input\n";
        return 0;
    } else {
        std::cout << "Parse failed\n";
        return 1;
    }
}